

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# python_generator.cc
# Opt level: O2

void __thiscall
google::protobuf::compiler::python::Generator::
PrintSerializedPbInterval<google::protobuf::ServiceDescriptor,google::protobuf::ServiceDescriptorProto>
          (Generator *this,ServiceDescriptor *descriptor,ServiceDescriptorProto *proto,string *name)

{
  Printer *this_00;
  int i32;
  LogMessage *other;
  AlphaNum *a;
  AlphaNum *a_00;
  string sp;
  string local_c0;
  LogMessage local_a0;
  string local_68;
  AlphaNum local_48;
  
  ServiceDescriptor::CopyTo(descriptor,proto);
  sp._M_dataplus._M_p = (pointer)&sp.field_2;
  sp._M_string_length = 0;
  sp.field_2._M_local_buf[0] = '\0';
  MessageLite::SerializeToString((MessageLite *)proto,&sp);
  i32 = std::__cxx11::string::find((string *)&this->file_descriptor_serialized_,(ulong)&sp);
  if (i32 < 0) {
    internal::LogMessage::LogMessage
              (&local_a0,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_c_cmakelists/apple[P]coremltools/deps/protobuf/src/google/protobuf/compiler/python/python_generator.cc"
               ,0x543);
    other = internal::LogMessage::operator<<(&local_a0,"CHECK failed: (offset) >= (0): ");
    internal::LogFinisher::operator=((LogFinisher *)&local_48,other);
    internal::LogMessage::~LogMessage(&local_a0);
  }
  this_00 = this->printer_;
  strings::AlphaNum::AlphaNum((AlphaNum *)&local_a0,i32);
  StrCat_abi_cxx11_(&local_c0,(protobuf *)&local_a0,a);
  strings::AlphaNum::AlphaNum(&local_48,(long)i32 + sp._M_string_length);
  StrCat_abi_cxx11_(&local_68,(protobuf *)&local_48,a_00);
  io::Printer::
  Print<char[5],std::__cxx11::string,char[17],std::__cxx11::string,char[15],std::__cxx11::string>
            (this_00,
             "$name$._serialized_start=$serialized_start$\n$name$._serialized_end=$serialized_end$\n"
             ,(char (*) [5])0x3de831,name,(char (*) [17])"serialized_start",&local_c0,
             (char (*) [15])"serialized_end",&local_68);
  std::__cxx11::string::~string((string *)&local_68);
  std::__cxx11::string::~string((string *)&local_c0);
  std::__cxx11::string::~string((string *)&sp);
  return;
}

Assistant:

void Generator::PrintSerializedPbInterval(const DescriptorT& descriptor,
                                          DescriptorProtoT& proto,
                                          const std::string& name) const {
  descriptor.CopyTo(&proto);
  std::string sp;
  proto.SerializeToString(&sp);
  int offset = file_descriptor_serialized_.find(sp);
  GOOGLE_CHECK_GE(offset, 0);

  printer_->Print(
      "$name$._serialized_start=$serialized_start$\n"
      "$name$._serialized_end=$serialized_end$\n",
      "name", name, "serialized_start", StrCat(offset), "serialized_end",
      StrCat(offset + sp.size()));
}